

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O3

void __thiscall Quass::solve(Quass *this,QpVector *x0,QpVector *ra,Basis *b0,HighsTimer *timer)

{
  HighsInt *pHVar1;
  double *pdVar2;
  Matrix *this_00;
  PricingStrategy PVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  int *piVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  Basis *this_01;
  QpModelStatus QVar12;
  int iVar13;
  QpSolverStatus QVar14;
  const_iterator __begin1;
  rep_conflict rVar15;
  ulong uVar16;
  QpVector *pQVar17;
  Runtime *pRVar18;
  int *piVar19;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var20;
  mapped_type *pmVar21;
  Runtime *l;
  pointer extraout_RDX;
  void *__buf;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer pdVar22;
  pointer extraout_RDX_02;
  Runtime *pRVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  undefined4 uVar27;
  HighsInt HVar28;
  uint uVar29;
  bool bVar30;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar31;
  double dVar32;
  QpVector p;
  QpVector buffer_yp;
  QpVector buffer_d;
  Gradient gradient;
  RatiotestResult stepres;
  ReducedGradient redgrad;
  QpVector buffer_m;
  QpVector rowmove;
  ReducedCosts redcosts;
  CholeskyFactor factor;
  QpVector buffer_Qp;
  QpVector buffer_gyp;
  QpVector yyp;
  SteepestEdgePricing *local_5d8;
  int local_5cc;
  double local_5c8;
  undefined8 uStack_5c0;
  uint local_5b4;
  QpVector local_5b0;
  double local_578;
  undefined8 uStack_570;
  QpVector local_560;
  double local_528;
  undefined8 uStack_520;
  double local_518;
  undefined8 uStack_510;
  QpVector local_508;
  double local_4d0;
  HighsTimer *local_4c8;
  Gradient local_4c0;
  undefined1 local_478 [12];
  bool bStack_46c;
  pointer local_458;
  ReducedGradient local_440;
  undefined1 local_3f0 [8];
  vector<int,_std::allocator<int>_> local_3e8;
  vector<double,_std::allocator<double>_> local_3d0;
  QpVector local_3b8;
  QpVector local_380;
  ReducedCosts local_348;
  CholeskyFactor local_2f8;
  QpVector local_2a0;
  QpVector local_268;
  undefined1 local_230 [8];
  vector<int,_std::allocator<int>_> local_228;
  vector<double,_std::allocator<double>_> local_210 [20];
  
  rVar15 = std::chrono::_V2::system_clock::now();
  pRVar23 = this->runtime;
  (pRVar23->statistics->time_start).__d.__r = rVar15;
  HVar28 = x0->dim;
  (pRVar23->primal).num_nz = x0->num_nz;
  (pRVar23->primal).dim = HVar28;
  std::vector<int,_std::allocator<int>_>::operator=(&(pRVar23->primal).index,&x0->index);
  std::vector<double,_std::allocator<double>_>::operator=(&(pRVar23->primal).value,&x0->value);
  local_4c0.runtime = this->runtime;
  QpVector::QpVector(&local_4c0.gradient,((local_4c0.runtime)->instance).num_var);
  local_4c0.uptodate = false;
  local_4c0.numupdates = 0;
  local_348.basis = b0;
  local_348.gradient = &local_4c0;
  QpVector::QpVector(&local_348.reducedcosts,(this->runtime->instance).num_var);
  local_348.uptodate = false;
  QpVector::QpVector(&local_440.rg,(this->runtime->instance).num_var);
  local_440.uptodate = false;
  local_440.gradient = &local_4c0;
  local_440.basis = b0;
  CholeskyFactor::CholeskyFactor(&local_2f8,this->runtime,b0);
  pRVar23 = this->runtime;
  MatrixBase::mat_vec_seq(&(pRVar23->instance).A.mat,&pRVar23->primal,&pRVar23->rowactivity);
  pRVar23 = this->runtime;
  PVar3 = (pRVar23->settings).pricing;
  if (PVar3 == Devex) {
    local_5d8 = (SteepestEdgePricing *)operator_new(0x38);
    (local_5d8->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_price_004412b8;
    local_5d8->runtime = pRVar23;
    local_5d8->basis = b0;
    local_5d8->redcosts = &local_348;
    local_230 = (undefined1  [8])0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_5d8->weights,(long)(pRVar23->instance).num_var,
               (value_type_conflict1 *)local_230,(allocator_type *)local_478);
  }
  else if (PVar3 == DantzigWolfe) {
    local_5d8 = (SteepestEdgePricing *)operator_new(0x20);
    (local_5d8->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_price_00441308;
    local_5d8->runtime = pRVar23;
    local_5d8->basis = b0;
    local_5d8->redcosts = &local_348;
  }
  else if (PVar3 == SteepestEdge) {
    local_5d8 = (SteepestEdgePricing *)operator_new(0x38);
    SteepestEdgePricing::SteepestEdgePricing(local_5d8,pRVar23,b0,&local_348);
  }
  else {
    local_5d8 = (SteepestEdgePricing *)0x0;
  }
  QpVector::QpVector(&local_5b0,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_380,(this->runtime->instance).num_con);
  QpVector::QpVector(&local_560,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_268,(this->runtime->instance).num_var);
  QpVector::QpVector((QpVector *)local_3f0,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_3b8,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_2a0,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_508,(this->runtime->instance).num_var);
  pRVar23 = this->runtime;
  if (((pRVar23->settings).hessianregularization == true) &&
     (uVar16 = (ulong)(pRVar23->instance).num_var, 0 < (long)uVar16)) {
    piVar5 = (pRVar23->instance).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pRVar23->instance).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar24 = 0;
    iVar13 = *piVar5;
    do {
      iVar4 = piVar5[uVar24 + 1];
      if (iVar13 < iVar4) {
        pdVar22 = (pRVar23->instance).Q.mat.value.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar26 = (long)iVar13;
        do {
          if (uVar24 == (uint)piVar6[lVar26]) {
            pdVar22[lVar26] = (pRVar23->settings).hessianregularizationfactor + pdVar22[lVar26];
          }
          lVar26 = lVar26 + 1;
        } while (iVar4 != lVar26);
      }
      uVar24 = uVar24 + 1;
      iVar13 = iVar4;
    } while (uVar24 != uVar16);
  }
  ratiotest_relax_instance((Instance *)local_230,pRVar23);
  Instance::operator=(&this->runtime->relaxed_for_ratiotest,(Instance *)local_230);
  Instance::~Instance((Instance *)local_230);
  pRVar23 = this->runtime;
  iVar13 = pRVar23->statistics->num_iterations;
  QVar12 = kIterationLimit;
  if (iVar13 < (pRVar23->settings).iteration_limit) {
    bVar30 = (pRVar23->instance).num_var ==
             (int)((ulong)((long)(b0->active_constraint_index).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(b0->active_constraint_index).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    local_5b4 = iVar13 - 1;
    l = (Runtime *)(ulong)local_5b4;
    local_518 = 0.0;
    local_578 = 10.0;
    uStack_570 = 0;
    pdVar22 = extraout_RDX;
    local_4c8 = timer;
    do {
      HighsTimer::read(timer,0,pdVar22,(size_t)l);
      pRVar23 = this->runtime;
      if ((pRVar23->settings).time_limit <= extraout_XMM0_Qa) {
        QVar12 = kTimeLimit;
        goto LAB_003355de;
      }
      if ((pRVar23->settings).nullspace_limit <
          (int)((ulong)((long)(b0->non_active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(b0->non_active_constraint_index).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
        Eventhandler<int_&>::fire
                  (&(pRVar23->settings).nullspace_limit_log,&(pRVar23->settings).nullspace_limit);
        this->runtime->status = kLargeNullspace;
        goto LAB_0033581d;
      }
      HighsTimer::read(timer,0,__buf,(size_t)l);
      pRVar23 = this->runtime;
      uVar29 = pRVar23->statistics->num_iterations;
      iVar13 = (pRVar23->settings).reportingfequency;
      local_5c8 = extraout_XMM0_Qa_00;
      if ((local_578 < extraout_XMM0_Qa_00 - local_518 || (int)uVar29 % iVar13 == 0) &&
         ((int)local_5b4 < (int)uVar29)) {
        uVar10 = iVar13 * 10;
        if (uVar29 == uVar10 || SBORROW4(uVar29,uVar10) != (int)(uVar29 + iVar13 * -10) < 0) {
          loginformation(pRVar23,b0,&local_2f8,timer);
          local_518 = local_578 * 10.0;
          uStack_510 = uStack_570;
          Eventhandler<Statistics_&>::fire
                    (&(this->runtime->settings).iteration_log,this->runtime->statistics);
          local_578 = (double)(~-(ulong)(local_518 < local_5c8) & (ulong)local_578 |
                              (ulong)(local_578 + local_578) & -(ulong)(local_518 < local_5c8));
          local_518 = local_5c8;
          local_5b4 = uVar29;
        }
        else {
          (pRVar23->settings).reportingfequency = uVar10;
          uVar16 = -(ulong)(local_578 * 10.0 < extraout_XMM0_Qa_00);
          local_578 = (double)(~uVar16 & (ulong)local_578 | (ulong)(local_578 + local_578) & uVar16)
          ;
        }
      }
      if (b0->reinversion_hint == true) {
        Basis::rebuild(b0);
        CholeskyFactor::recompute(&local_2f8);
        MatrixBase::vec_mat_1
                  (&((local_4c0.runtime)->instance).Q.mat,&(local_4c0.runtime)->primal,
                   &local_4c0.gradient);
        QpVector::operator+=(&local_4c0.gradient,&((local_4c0.runtime)->instance).c);
        this_01 = local_348.basis;
        local_4c0.uptodate = true;
        local_4c0.numupdates = 0;
        pQVar17 = Gradient::getGradient(local_348.gradient);
        Basis::ftran(this_01,pQVar17,&local_348.reducedcosts,false,-1);
        local_348.uptodate = true;
        ReducedGradient::recompute(&local_440);
      }
      if (bVar30) {
        pRVar23 = this->runtime;
        pQVar17 = Gradient::getGradient(&local_4c0);
        iVar13 = (**(local_5d8->super_Pricing)._vptr_Pricing)(local_5d8,&pRVar23->primal,pQVar17);
        pRVar23 = this->runtime;
        if (iVar13 == -1) {
          QVar12 = kOptimal;
          goto LAB_003355de;
        }
        pHVar1 = &pRVar23->statistics->num_iterations;
        *pHVar1 = *pHVar1 + 1;
        iVar4 = (b0->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar13];
        if (0 < local_560.num_nz) {
          lVar26 = 0;
          do {
            local_560.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [local_560.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar26]] = 0.0;
            local_560.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar26] = 0;
            lVar26 = lVar26 + 1;
          } while (lVar26 < local_560.num_nz);
        }
        *local_560.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = iVar4;
        local_560.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4] = 1.0;
        local_560.num_nz = 1;
        Basis::btran(b0,&local_560,&local_560,true,iVar13);
        local_3b8.dim =
             (HighsInt)
             ((ulong)((long)(b0->non_active_constraint_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(b0->non_active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
        local_3f0._4_4_ = local_3b8.dim;
        pRVar23 = this->runtime;
        QpVector::QpVector((QpVector *)local_230,&local_560);
        MatrixBase::mat_vec_seq(&(pRVar23->instance).Q.mat,(QpVector *)local_230,&local_268);
        if ((int)((ulong)((long)(b0->active_constraint_index).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(b0->active_constraint_index).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) < (pRVar23->instance).num_var
           ) {
          Basis::Ztprod(b0,&local_268,&local_3b8,false,-1);
          local_3f0._4_4_ = local_3b8.dim;
          local_3f0._0_4_ = local_3b8.num_nz;
          std::vector<int,_std::allocator<int>_>::operator=(&local_3e8,&local_3b8.index);
          std::vector<double,_std::allocator<double>_>::operator=(&local_3d0,&local_3b8.value);
          CholeskyFactor::solveL(&local_2f8,(QpVector *)local_3f0);
          QpVector::QpVector((QpVector *)local_478,(QpVector *)local_3f0);
          CholeskyFactor::solveLT(&local_2f8,(QpVector *)local_478);
          Basis::Zprod(b0,(QpVector *)local_478,&local_5b0);
          pQVar17 = Gradient::getGradient(&local_4c0);
          dVar32 = -1.0;
          if (0 < (long)pQVar17->num_nz) {
            dVar31 = 0.0;
            lVar26 = 0;
            do {
              iVar4 = (pQVar17->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar26];
              dVar31 = dVar31 + (pQVar17->value).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar4] *
                                local_210[0].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar4];
              lVar26 = lVar26 + 1;
            } while (pQVar17->num_nz != lVar26);
            dVar32 = -1.0;
            if (dVar31 < 0.0) {
              dVar32 = 1.0;
            }
          }
          QpVector::saxpy(&local_5b0,-1.0,dVar32,(QpVector *)local_230);
          if (local_458 != (pointer)0x0) {
            operator_delete(local_458);
          }
          if (stack0xfffffffffffffb90 != (pointer)0x0) {
            operator_delete(stack0xfffffffffffffb90);
          }
        }
        else {
          if (0 < local_5b0.num_nz) {
            lVar26 = 0;
            do {
              local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [(&((Instance *)
                 local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start)->sense)[lVar26]] = 0.0;
              (&((Instance *)
                local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start)->sense)[lVar26] = 0;
              lVar26 = lVar26 + 1;
            } while (lVar26 < local_5b0.num_nz);
          }
          if (0 < local_560.num_nz) {
            lVar26 = 0;
            do {
              iVar4 = local_560.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar26];
              (&((Instance *)
                local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start)->sense)[lVar26] = iVar4;
              local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4] =
                   local_560.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar4];
              lVar26 = lVar26 + 1;
            } while (lVar26 < local_560.num_nz);
          }
          local_5b0.num_nz = local_560.num_nz;
          pQVar17 = Gradient::getGradient(&local_4c0);
          if ((long)pQVar17->num_nz < 1) {
            dVar32 = 0.0;
          }
          else {
            dVar32 = 0.0;
            lVar26 = 0;
            do {
              iVar4 = (pQVar17->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar26];
              dVar32 = dVar32 + (pQVar17->value).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar4] *
                                local_560.value.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar4];
              lVar26 = lVar26 + 1;
            } while (pQVar17->num_nz != lVar26);
          }
          if (0 < (long)local_5b0.num_nz) {
            lVar26 = 0;
            do {
              iVar4 = (&((Instance *)
                        local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start)->sense)[lVar26];
              local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4] =
                   local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar4] * -dVar32;
              lVar26 = lVar26 + 1;
            } while (local_5b0.num_nz != lVar26);
          }
        }
        if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Basis::deactivate(b0,iVar13);
        MatrixBase::mat_vec_seq(&(this->runtime->instance).A.mat,&local_5b0,&local_380);
        pRVar23 = this->runtime;
        piVar19 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar7 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (piVar19 != piVar7) {
          iVar4 = (pRVar23->instance).num_con;
          do {
            pdVar22 = local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar11 = iVar4;
            if (*piVar19 < iVar4) {
              pdVar22 = local_380.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar11 = 0;
            }
            pdVar22[(uint)(*piVar19 - iVar11)] = 0.0;
            piVar19 = piVar19 + 1;
          } while (piVar19 != piVar7);
        }
        pQVar17 = MatrixBase::mat_vec_seq(&(pRVar23->instance).Q.mat,&local_5b0,&local_2a0);
        l = (Runtime *)(long)local_5b0.num_nz;
        if ((long)l < 1) {
          local_528 = 0.0;
        }
        else {
          local_528 = 0.0;
          pRVar18 = (Runtime *)0x0;
          do {
            iVar4 = (&((Instance *)
                      local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start)->sense)[(long)pRVar18];
            local_528 = local_528 +
                        local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar4] *
                        (pQVar17->value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[iVar4];
            pRVar18 = (Runtime *)((long)&(pRVar18->instance).sense + 1);
          } while (l != pRVar18);
        }
        uStack_520 = 0;
        dVar32 = ABS(local_528);
        pdVar2 = &(pRVar23->settings).pQp_zero_threshold;
        bVar8 = dVar32 == *pdVar2;
        bVar9 = dVar32 < *pdVar2;
        uVar27 = CONCAT31((int3)((uint)iVar13 >> 8),bVar9 || bVar8);
        local_5c8 = INFINITY;
        uStack_5c0 = 0;
        if (!bVar9 && !bVar8) {
          pQVar17 = Gradient::getGradient(&local_4c0);
          if ((long)local_5b0.num_nz < 1) {
            local_5c8 = 0.0;
          }
          else {
            local_5c8 = 0.0;
            lVar26 = 0;
            do {
              iVar13 = (&((Instance *)
                         local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start)->sense)[lVar26];
              local_5c8 = local_5c8 +
                          local_5b0.value.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[iVar13] *
                          (pQVar17->value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[iVar13];
              lVar26 = lVar26 + 1;
            } while (local_5b0.num_nz != lVar26);
          }
          uStack_5c0 = 0;
          l = (Runtime *)local_3f0;
          QVar14 = CholeskyFactor::expand(&local_2f8,&local_560,&local_268,(QpVector *)l,&local_3b8)
          ;
          if (QVar14 != OK) {
            this->runtime->status = kUndetermined;
            goto LAB_0033581d;
          }
          local_5c8 = (double)(~-(ulong)(-local_5c8 < local_5c8) & (ulong)(-local_5c8 / local_528));
        }
        uStack_5c0 = 0;
        ReducedGradient::expand(&local_440,&local_560);
        pdVar22 = extraout_RDX_01;
      }
      else {
        if (local_440.uptodate == false) {
          ReducedGradient::recompute(&local_440);
        }
        QpVector::operator-((QpVector *)local_230,&local_440.rg);
        if ((int)local_230._0_4_ < 1) {
          iVar13 = 0;
        }
        else {
          lVar26 = 0;
          iVar13 = 0;
          do {
            iVar4 = *(int *)((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar26 * 4);
            if (ABS(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4]) <= 1e-14) {
              local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4] = 0.0;
              *(int *)((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar26 * 4) = 0;
            }
            else {
              lVar25 = (long)iVar13;
              iVar13 = iVar13 + 1;
              *(int *)((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar25 * 4) = iVar4;
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 < (int)local_230._0_4_);
        }
        local_230._0_4_ = iVar13;
        CholeskyFactor::solve(&local_2f8,(QpVector *)local_230);
        if ((int)local_230._0_4_ < 1) {
          iVar13 = 0;
        }
        else {
          lVar26 = 0;
          iVar13 = 0;
          do {
            iVar4 = *(int *)((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar26 * 4);
            if (ABS(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4]) <= 1e-14) {
              local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4] = 0.0;
              *(int *)((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar26 * 4) = 0;
            }
            else {
              lVar25 = (long)iVar13;
              iVar13 = iVar13 + 1;
              *(int *)((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar25 * 4) = iVar4;
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 < (int)local_230._0_4_);
        }
        local_230._0_4_ = iVar13;
        Basis::Zprod(b0,(QpVector *)local_230,&local_5b0);
        if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        MatrixBase::mat_vec_seq(&(this->runtime->instance).A.mat,&local_5b0,&local_380);
        pRVar23 = this->runtime;
        pRVar18 = (Runtime *)
                  (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        l = (Runtime *)
            (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
        if (pRVar18 != l) {
          iVar13 = (pRVar23->instance).num_con;
          do {
            iVar4 = (pRVar18->instance).sense;
            pdVar22 = local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar11 = iVar13;
            if (iVar4 < iVar13) {
              pdVar22 = local_380.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar11 = 0;
            }
            pdVar22[(uint)(iVar4 - iVar11)] = 0.0;
            pRVar18 = (Runtime *)&(pRVar18->instance).num_var;
          } while (pRVar18 != l);
        }
        MatrixBase::mat_vec_seq(&(pRVar23->instance).Q.mat,&local_5b0,&local_2a0);
        uVar27 = 0;
        local_5c8 = 1.0;
        uStack_5c0 = 0;
        pdVar22 = extraout_RDX_00;
      }
      if ((long)local_5b0.num_nz < 1) {
        dVar32 = 0.0;
      }
      else {
        dVar32 = 0.0;
        lVar26 = 0;
        do {
          dVar32 = dVar32 + local_5b0.value.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [(&((Instance *)
                               local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start)->sense)[lVar26]] *
                            local_5b0.value.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [(&((Instance *)
                               local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start)->sense)[lVar26]];
          lVar26 = lVar26 + 1;
          l = (Runtime *)
              local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
          pdVar22 = local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_5b0.num_nz != lVar26);
      }
      pRVar23 = this->runtime;
      bVar8 = true;
      if (((local_5c8 != 0.0) || (NAN(local_5c8))) &&
         ((pRVar23->settings).pnorm_zero_threshold <= dVar32)) {
        pHVar1 = &pRVar23->statistics->num_iterations;
        *pHVar1 = *pHVar1 + 1;
        _local_478 = ratiotest(pRVar23,&local_5b0,&local_380,local_5c8);
        if (local_478._8_4_ == -1) {
          if ((double)local_478._0_8_ < INFINITY) {
            if (local_440.uptodate == true) {
              local_440.uptodate = false;
            }
            bVar8 = false;
LAB_00335526:
            QpVector::saxpy(&this->runtime->primal,(double)local_478._0_8_,&local_5b0);
            QpVector::saxpy(&this->runtime->rowactivity,(double)local_478._0_8_,&local_380);
            QpVector::saxpy(&local_4c0.gradient,(double)local_478._0_8_,&local_2a0);
            local_4c0.numupdates = local_4c0.numupdates + 1;
            local_348.uptodate = false;
            pRVar23 = this->runtime;
            pdVar22 = extraout_RDX_02;
            goto LAB_0033558c;
          }
          QVar12 = kUnbounded;
        }
        else {
          local_5c8 = (double)CONCAT44(local_5c8._4_4_,uVar27);
          pRVar23 = this->runtime;
          local_5cc = local_478._8_4_;
          _Var20 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             ((b0->non_active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (b0->non_active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,&local_5cc);
          if ((_Var20._M_current ==
               (b0->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish) ||
             (HVar28 = (HighsInt)
                       ((ulong)((long)_Var20._M_current -
                               (long)(b0->non_active_constraint_index).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2), HVar28 == -1)) {
            this_00 = &(pRVar23->instance).A;
            if ((pRVar23->instance).A.has_transpose == false) {
              Matrix::transpose(this_00);
              (pRVar23->instance).A.has_transpose = true;
            }
            MatrixBase::extractcol((QpVector *)local_230,&this_00->tran,local_5cc);
            Basis::Ztprod(b0,(QpVector *)local_230,&local_508,true,local_5cc);
            if (local_508.num_nz < 1) {
              uVar16 = 0;
              lVar26 = 0;
            }
            else {
              uVar29 = 0;
              iVar13 = 0;
              lVar26 = 0;
              do {
                uVar16 = (ulong)local_508.index.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar26];
                iVar4 = local_508.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26];
                if (ABS(local_508.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16]) <=
                    ABS(local_508.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar13])) {
                  uVar16 = (ulong)uVar29;
                  iVar4 = iVar13;
                }
                iVar13 = iVar4;
                lVar26 = lVar26 + 1;
                uVar29 = (uint)uVar16;
              } while (lVar26 < local_508.num_nz);
              lVar26 = (long)iVar13;
            }
            iVar13 = (b0->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar26];
            HVar28 = (HighsInt)uVar16;
            local_528 = ABS(local_508.value.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[HVar28]);
            local_4d0 = (pRVar23->settings).d_zero_threshold;
            uStack_520 = 0;
            if (local_528 < local_4d0) {
              log10(local_528);
              printf("degeneracy? not possible to find non-active constraint to leave basis. max: log(d[%d]) = %lf\n"
                     ,uVar16 & 0xffffffff);
            }
            if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((pointer)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_4d0 <= local_528) goto LAB_00335430;
          }
          else {
            if (0 < local_508.num_nz) {
              lVar26 = 0;
              do {
                local_508.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_508.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar26]] = 0.0;
                local_508.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar26] = 0;
                lVar26 = lVar26 + 1;
              } while (lVar26 < local_508.num_nz);
            }
            *local_508.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = HVar28;
            local_508.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[HVar28] = 1.0;
            local_508.num_nz = 1;
            iVar13 = local_5cc;
LAB_00335430:
            if (local_5c8._0_1_ == '\0') {
              _Var20 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                 ((b0->non_active_constraint_index).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (b0->non_active_constraint_index).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,local_478 + 8);
              CholeskyFactor::reduce
                        (&local_2f8,&local_508,HVar28,
                         (~((long)_Var20._M_current -
                           (long)(b0->non_active_constraint_index).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) & 0x3fffffffcU) != 0 &&
                         _Var20._M_current !=
                         (b0->non_active_constraint_index).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            ReducedGradient::reduce(&local_440,&local_508,HVar28);
            if (local_440.uptodate == true) {
              local_440.uptodate = false;
            }
            QVar14 = Basis::activate(b0,&this->runtime->settings,local_478._8_4_,
                                     kActiveAtUpper - bStack_46c,iVar13,&local_5d8->super_Pricing);
            if (QVar14 == OK) {
              l = this->runtime;
              bVar8 = (bool)((l->instance).num_var ==
                             (int)((ulong)((long)(b0->active_constraint_index).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)(b0->active_constraint_index).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 2) &
                            bVar30);
              timer = local_4c8;
              goto LAB_00335526;
            }
          }
          QVar12 = kUndetermined;
        }
        this->runtime->status = QVar12;
        goto LAB_0033581d;
      }
LAB_0033558c:
      bVar30 = bVar8;
    } while (pRVar23->statistics->num_iterations < (pRVar23->settings).iteration_limit);
    QVar12 = kIterationLimit;
  }
LAB_003355de:
  pRVar23->status = QVar12;
  loginformation(pRVar23,b0,&local_2f8,timer);
  Eventhandler<Statistics_&>::fire
            (&(this->runtime->settings).iteration_log,this->runtime->statistics);
  pRVar23 = this->runtime;
  MatrixBase::mat_vec((QpVector *)local_230,&(pRVar23->instance).A.mat,&pRVar23->primal);
  Instance::sumnumprimalinfeasibilities(&pRVar23->instance,&pRVar23->primal,(QpVector *)local_230);
  if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pQVar17 = ReducedCosts::getReducedCosts(&local_348);
  piVar19 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar23 = this->runtime;
  if (piVar19 != piVar7) {
    piVar5 = (b0->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar13 = (pRVar23->instance).num_con;
    pdVar22 = (pQVar17->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar4 = *piVar19;
      pQVar17 = &pRVar23->dualvar;
      if (iVar4 < iVar13) {
        pQVar17 = &pRVar23->dualcon;
      }
      lVar26 = (long)(iVar4 - iVar13);
      if (iVar4 < iVar13) {
        lVar26 = (long)iVar4;
      }
      (pQVar17->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar26] = pdVar22[piVar5[iVar4]];
      piVar19 = piVar19 + 1;
    } while (piVar19 != piVar7);
  }
  QpVector::resparsify(&pRVar23->dualcon);
  QpVector::resparsify(&this->runtime->dualvar);
  pRVar23 = this->runtime;
  if (0 < (pRVar23->instance).num_var) {
    lVar26 = 0;
    do {
      local_230._0_4_ = (pRVar23->instance).num_con + (int)lVar26;
      pmVar21 = std::
                map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
                ::operator[](&b0->basisstatus,(key_type_conflict1 *)local_230);
      pRVar23 = this->runtime;
      (pRVar23->status_var).super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start[lVar26] = *pmVar21;
      lVar26 = lVar26 + 1;
    } while (lVar26 < (pRVar23->instance).num_var);
  }
  if (0 < (pRVar23->instance).num_con) {
    lVar26 = 0;
    do {
      local_230._0_4_ = (int)lVar26;
      pmVar21 = std::
                map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
                ::operator[](&b0->basisstatus,(key_type_conflict1 *)local_230);
      pRVar23 = this->runtime;
      (pRVar23->status_con).super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start[lVar26] = *pmVar21;
      lVar26 = lVar26 + 1;
    } while (lVar26 < (pRVar23->instance).num_con);
  }
  if ((pRVar23->instance).num_var ==
      (int)((ulong)((long)(b0->active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
    Basis::recomputex((QpVector *)local_230,b0,&pRVar23->instance);
    pRVar23 = this->runtime;
    (pRVar23->primal).num_nz = local_230._0_4_;
    (pRVar23->primal).dim = local_230._4_4_;
    std::vector<int,_std::allocator<int>_>::operator=(&(pRVar23->primal).index,&local_228);
    std::vector<double,_std::allocator<double>_>::operator=(&(pRVar23->primal).value,local_210);
    if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  rVar15 = std::chrono::_V2::system_clock::now();
  (this->runtime->statistics->time_end).__d.__r = rVar15;
LAB_0033581d:
  if (local_508.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_508.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_508.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_508.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3b8.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_3b8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_560.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_560.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_560.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_560.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_380.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_380.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_380.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_380.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5b0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((Runtime *)
      local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Runtime *)0x0) {
    operator_delete(local_5b0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8 != (SteepestEdgePricing *)0x0) {
    (*(local_5d8->super_Pricing)._vptr_Pricing[4])();
  }
  if (local_2f8.a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f8.L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_440.rg.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.rg.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_440.rg.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.rg.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_348.reducedcosts.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.reducedcosts.value.super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.reducedcosts.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.reducedcosts.index.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4c0.gradient.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.gradient.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4c0.gradient.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.gradient.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Quass::solve(const QpVector& x0, const QpVector& ra, Basis& b0,
                  HighsTimer& timer) {
  // feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT & ~FE_UNDERFLOW);

  runtime.statistics.time_start = std::chrono::high_resolution_clock::now();
  Basis& basis = b0;
  runtime.primal = x0;

  // TODO: remove redundant equations before starting
  // HOWTO: from crash start, check all (near-)equality constraints (not
  // bounds). if the residual is 0 (or near-zero?), remove constraint

  Gradient gradient(runtime);
  ReducedCosts redcosts(runtime, basis, gradient);
  ReducedGradient redgrad(runtime, basis, gradient);
  CholeskyFactor factor(runtime, basis);
  runtime.instance.A.mat_vec(runtime.primal, runtime.rowactivity);
  std::unique_ptr<Pricing> pricing = getPricing(runtime, basis, redcosts);

  QpVector p(runtime.instance.num_var);
  QpVector rowmove(runtime.instance.num_con);

  QpVector buffer_yp(runtime.instance.num_var);
  QpVector buffer_gyp(runtime.instance.num_var);
  QpVector buffer_l(runtime.instance.num_var);
  QpVector buffer_m(runtime.instance.num_var);

  QpVector buffer_Qp(runtime.instance.num_var);

  // buffers for reduction
  QpVector buffer_d(runtime.instance.num_var);

  regularize(runtime);

  runtime.relaxed_for_ratiotest = ratiotest_relax_instance(runtime);

  HighsInt last_logging_iteration = runtime.statistics.num_iterations - 1;
  double last_logging_time = 0;
  double logging_time_interval = 10;

  const HighsInt current_num_active = basis.getnumactive();
  bool atfsep = current_num_active == runtime.instance.num_var;
  while (true) {
    // check iteration limit
    if (runtime.statistics.num_iterations >= runtime.settings.iteration_limit) {
      runtime.status = QpModelStatus::kIterationLimit;
      break;
    }

    // check time limit
    if (timer.read() >= runtime.settings.time_limit) {
      runtime.status = QpModelStatus::kTimeLimit;
      break;
    }

    if (basis.getnuminactive() > runtime.settings.nullspace_limit) {
      runtime.settings.nullspace_limit_log.fire(
          runtime.settings.nullspace_limit);
      runtime.status = QpModelStatus::kLargeNullspace;
      return;
    }

    // LOGGING
    double run_time = timer.read();
    if ((runtime.statistics.num_iterations %
                 runtime.settings.reportingfequency ==
             0 ||
         run_time - last_logging_time > logging_time_interval) &&
        runtime.statistics.num_iterations > last_logging_iteration) {
      bool log_report = true;
      if (runtime.statistics.num_iterations >
          10 * runtime.settings.reportingfequency) {
        runtime.settings.reportingfequency *= 10;
        log_report = false;
      }
      if (run_time > 10 * logging_time_interval) logging_time_interval *= 2.0;
      if (log_report) {
        last_logging_time = run_time;
        last_logging_iteration = runtime.statistics.num_iterations;
        loginformation(runtime, basis, factor, timer);
        runtime.settings.iteration_log.fire(runtime.statistics);
      }
    }

    // REINVERSION
    if (check_reinvert_due(basis)) {
      reinvert(basis, factor, gradient, redcosts, redgrad, pricing);
    }

    QpSolverStatus status;

    bool zero_curvature_direction = false;
    double maxsteplength = 1.0;
    if (atfsep) {
      // Determine a variable to relax from being active. If there is
      // none, then basis is optimal
      HighsInt minidx = pricing->price(runtime.primal, gradient.getGradient());
      if (minidx == -1) {
        runtime.status = QpModelStatus::kOptimal;
        break;
      }
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      HighsInt unit = basis.getindexinfactor()[minidx];
      QpVector::unit(runtime.instance.num_var, unit, buffer_yp);
      basis.btran(buffer_yp, buffer_yp, true, minidx);

      buffer_l.dim = basis.getnuminactive();
      buffer_m.dim = basis.getnuminactive();
      computesearchdirection_major(runtime, basis, factor, buffer_yp, gradient,
                                   buffer_gyp, buffer_l, buffer_m, p);
      basis.deactivate(minidx);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      maxsteplength = std::numeric_limits<double>::infinity();
      // if (runtime.instance.Q.mat.value.size() > 0) {
      maxsteplength = computemaxsteplength(runtime, p, gradient, buffer_Qp,
                                           zero_curvature_direction);
      if (!zero_curvature_direction) {
        status = factor.expand(buffer_yp, buffer_gyp, buffer_l, buffer_m);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
      }
      redgrad.expand(buffer_yp);
    } else {
      // Compute a search direction - which may be zero, in which case
      // atfsep is set true and the loop repeats with this
      // condition. In particular, this happens when the current basis
      // is optimal
      computesearchdirection_minor(runtime, basis, factor, redgrad, p);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      runtime.instance.Q.mat_vec(p, buffer_Qp);
    }
    if (p.norm2() < runtime.settings.pnorm_zero_threshold ||
        maxsteplength == 0.0 ||
        (false && fabs(gradient.getGradient().dot(p)) <
                      runtime.settings.improvement_zero_threshold)) {
      atfsep = true;
    } else {
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      RatiotestResult stepres = ratiotest(runtime, p, rowmove, maxsteplength);
      if (stepres.limitingconstraint != -1) {
        HighsInt constrainttodrop;
        HighsInt maxabsd;
        status = reduce(runtime, basis, stepres.limitingconstraint, buffer_d,
                        maxabsd, constrainttodrop);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (!zero_curvature_direction) {
          factor.reduce(
              buffer_d, maxabsd,
              indexof(basis.getinactive(), stepres.limitingconstraint) != -1);
        }
        redgrad.reduce(buffer_d, maxabsd);
        redgrad.update(stepres.alpha, false);

        status = basis.activate(runtime.settings, stepres.limitingconstraint,
                                stepres.nowactiveatlower
                                    ? BasisStatus::kActiveAtLower
                                    : BasisStatus::kActiveAtUpper,
                                constrainttodrop, pricing.get());
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (basis.getnumactive() != runtime.instance.num_var) {
          atfsep = false;
        }
      } else {
        if (stepres.alpha == std::numeric_limits<double>::infinity()) {
          // unbounded
          runtime.status = QpModelStatus::kUnbounded;
          return;
        }
        atfsep = false;
        redgrad.update(stepres.alpha, false);
      }

      runtime.primal.saxpy(stepres.alpha, p);
      runtime.rowactivity.saxpy(stepres.alpha, rowmove);

      gradient.update(buffer_Qp, stepres.alpha);
      redcosts.update();
    }
  }

  loginformation(runtime, basis, factor, timer);
  runtime.settings.iteration_log.fire(runtime.statistics);
  //  basis.report();

  runtime.instance.sumnumprimalinfeasibilities(
      runtime.primal, runtime.instance.A.mat_vec(runtime.primal));

  QpVector& lambda = redcosts.getReducedCosts();
  for (auto e : basis.getactive()) {
    HighsInt indexinbasis = basis.getindexinfactor()[e];
    if (e >= runtime.instance.num_con) {
      // active variable bound
      HighsInt var = e - runtime.instance.num_con;
      runtime.dualvar.value[var] = lambda.value[indexinbasis];
    } else {
      runtime.dualcon.value[e] = lambda.value[indexinbasis];
    }
  }
  runtime.dualcon.resparsify();
  runtime.dualvar.resparsify();

  // QpVector actual_dual_var(runtime.instance.num_var);
  // QpVector actual_dual_con(runtime.instance.num_con);
  // compute_actual_duals(runtime, basis, redcosts.getReducedCosts(),
  // actual_dual_con, actual_dual_var); printf("max primal violation =
  // %.20lf\n", compute_primal_violation(runtime)); printf("max dual   violation
  // = %.20lf\n", compute_dual_violation(runtime.instance, runtime.primal,
  // actual_dual_con, actual_dual_var));

  // extract basis status
  for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
    runtime.status_var[i] = basis.getstatus(runtime.instance.num_con + i);
  }

  for (HighsInt i = 0; i < runtime.instance.num_con; i++) {
    runtime.status_con[i] = basis.getstatus(i);
  }

  if (basis.getnumactive() == runtime.instance.num_var) {
    runtime.primal = basis.recomputex(runtime.instance);
  }
  // x.report("x");
  runtime.statistics.time_end = std::chrono::high_resolution_clock::now();
}